

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_rules.hpp
# Opt level: O2

void ovf::detail::parse::v2::ovf_segment_data_action<ovf::detail::parse::v2::bytes_bin_4>::
     apply<tao::pegtl::internal::action_input<tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>>,double>
               (action_input<tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *in,ovf_file *f,ovf_segment *segment,double *data)

{
  int iVar1;
  int iVar2;
  parser_state *ppVar3;
  ulong uVar4;
  ulong uVar5;
  string bytes_str;
  string local_40;
  
  tao::pegtl::internal::
  action_input<tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::string(&local_40,in);
  ppVar3 = f->_state;
  iVar1 = segment->valuedim;
  uVar5 = 0;
  uVar4 = (ulong)(uint)ppVar3->max_data_index;
  if (ppVar3->max_data_index < 1) {
    uVar4 = uVar5;
  }
  for (; uVar4 != uVar5; uVar5 = uVar5 + 1) {
    data[uVar5] = (double)*(float *)(local_40._M_dataplus._M_p + uVar5 * 4);
    iVar2 = ppVar3->current_column;
    ppVar3->current_column = iVar2 + 1;
    if (iVar1 <= iVar2) {
      ppVar3->current_column = 0;
      ppVar3->current_line = ppVar3->current_line + 1;
    }
  }
  ppVar3->current_column = 0;
  ppVar3->current_line = 0;
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

static void apply( const Input& in, ovf_file & f, const ovf_segment & segment, scalar * data )
            {
                std::string bytes_str = in.string();
                const uint8_t * bytes = reinterpret_cast<const uint8_t *>( bytes_str.c_str() );
                for( int idx=0; idx < f._state->max_data_index; ++idx )
                {
                    uint32_t ivalue = endian::from_little_32( &bytes[4*idx] );
                    float value = *reinterpret_cast<const float *>( &ivalue );

                    if( idx < f._state->max_data_index )
                    {
                        data[idx] = value;
                        ++f._state->current_column;
                    }

                    if( f._state->current_column > segment.valuedim )
                    {
                        f._state->current_column = 0;
                        ++f._state->current_line;
                    }
                }
                f._state->current_line = 0;
                f._state->current_column = 0;
            }